

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O0

void initmem(memory *m,int elemsize,int blocksize)

{
  void *pvVar1;
  int local_1c;
  int blocksize_local;
  int elemsize_local;
  memory *m_local;
  
  local_1c = blocksize;
  if (blocksize < 0x3e9) {
    local_1c = 1000;
  }
  m->blocksize = local_1c * elemsize;
  pvVar1 = malloc((long)m->blocksize);
  m->block[0] = pvVar1;
  m->allocnr = 0;
  m->nr = -1;
  m->last = (void *)0x0;
  m->first = (void *)0x0;
  m->current = (void *)0x0;
  return;
}

Assistant:

void initmem(memory *m, int elemsize, int blocksize)
{
   m->blocksize = MAX(blocksize, 1000) * elemsize;
   m->block[0] = malloc(m->blocksize);
   m->allocnr = 0;
   m->nr = -1;
   m->current = m->first = m->last = NULL;
}